

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::TimeZone::PrevTransition(TimeZone *this,Time t,CivilTransition *trans)

{
  bool bVar1;
  CivilTransition *in_R8;
  Time t_00;
  
  t_00.rep_.rep_lo_ = (uint32_t)trans;
  t_00.rep_.rep_hi_ = t.rep_.rep_hi_;
  bVar1 = anon_unknown_8::FindTransition((time_zone *)this,0x2f81a0,t_00,in_R8);
  return bVar1;
}

Assistant:

bool TimeZone::PrevTransition(Time t, CivilTransition* trans) const {
  return FindTransition(cz_, &cctz::time_zone::prev_transition, t, trans);
}